

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::connectionError
          (QHttp2ProtocolHandler *this,Http2Error errorCode,QString *message)

{
  bool bVar1;
  NetworkError NVar2;
  QString *in_RDX;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  NetworkError error;
  QLoggingCategoryMacroHolder<(QtMsgType)2> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QMessageLogger *message_00;
  NetworkError in_stack_ffffffffffffffac;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  message_00 = in_RDI;
  QtPrivateLogging::QT_HTTP2();
  anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)2>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)2> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)2>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)2> *)0x2d0cc7);
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)in_stack_ffffffffffffff68,(char *)0x2d0cdd);
    QMessageLogger::critical();
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffffb8);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff78);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  NVar2 = Http2::qt_error((quint32)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  QtPrivate::asString(in_RDX);
  QString::toLocal8Bit((QString *)CONCAT44(NVar2,in_stack_ffffffffffffff88));
  QByteArray::constData((QByteArray *)0x2d0d68);
  QHttpNetworkConnectionChannel::emitFinishedWithError
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)message_00);
  QByteArray::~QByteArray((QByteArray *)0x2d0d82);
  closeSession((QHttp2ProtocolHandler *)0x2d0d8c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::connectionError(Http2::Http2Error errorCode, const QString &message)
{
    Q_ASSERT(!message.isNull());

    qCCritical(QT_HTTP2) << "connection error:" << message;

    const auto error = qt_error(errorCode);
    m_channel->emitFinishedWithError(error, qPrintable(message));

    closeSession();
}